

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VL1Norm(N_Vector X,sunindextype param_2,sunindextype global_length,int myid)

{
  bool bVar1;
  double dVar2;
  realtype rVar3;
  double dVar4;
  realtype ans;
  double maxt;
  double stop_time;
  double start_time;
  int local_28;
  int failure;
  int fails;
  int myid_local;
  sunindextype global_length_local;
  sunindextype local_length_local;
  N_Vector X_local;
  
  local_28 = 0;
  N_VConst(-1.0,X);
  dVar2 = get_time();
  rVar3 = N_VL1Norm(X);
  sync_device();
  dVar4 = get_time();
  if (0.0 <= rVar3) {
    if (NAN(rVar3)) {
      bVar1 = true;
    }
    else {
      bVar1 = 1e-15 < ABS(rVar3 - (double)global_length) / ABS((double)global_length);
    }
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    printf(">>> FAILED test -- N_VL1Norm, Proc %d \n",(ulong)(uint)myid);
    local_28 = 1;
  }
  else if (myid == 0) {
    printf("PASSED test -- N_VL1Norm \n");
  }
  dVar2 = max_time(X,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VL1Norm");
  }
  return local_28;
}

Assistant:

int Test_N_VL1Norm(N_Vector X, sunindextype local_length,
                   sunindextype global_length, int myid)
{
  int      fails = 0, failure = 0;
  double   start_time, stop_time, maxt;
  realtype ans;

  /* fill vector data */
  N_VConst(NEG_ONE, X);

  start_time = get_time();
  ans = N_VL1Norm(X);
  sync_device();
  stop_time = get_time();

  /* ans should equal global_length */
  failure = (ans < ZERO) ? 1 : FNEQ(ans, global_length);

  if (failure) {
    printf(">>> FAILED test -- N_VL1Norm, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VL1Norm \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VL1Norm", maxt);

  return(fails);
}